

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_tst_xmlmodelserialiser.cpp
# Opt level: O1

void tst_XmlModelSerialiser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      autoParent((tst_XmlModelSerialiser *)_o);
      return;
    case 1:
      basicSaveLoadByteArray((tst_XmlModelSerialiser *)_o);
      return;
    case 2:
      basicSaveLoadFile((tst_XmlModelSerialiser *)_o);
      return;
    case 3:
      basicSaveLoadString((tst_XmlModelSerialiser *)_o);
      return;
    case 4:
      basicSaveLoadStream((tst_XmlModelSerialiser *)_o);
      return;
    case 5:
      basicSaveLoadNested((tst_XmlModelSerialiser *)_o);
      return;
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
      (*(code *)**(undefined8 **)(_o + 0x10))
                (_o + 0x10,_o,&switchD_00104a39::switchdataD_0010b010,
                 (code *)**(undefined8 **)(_o + 0x10));
      return;
    case 0xb:
      validateXmlOutput((tst_XmlModelSerialiser *)_o);
      return;
    case 0xc:
      validateXmlOutput_data((tst_XmlModelSerialiser *)_o);
      return;
    }
  }
  return;
}

Assistant:

void tst_XmlModelSerialiser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<tst_XmlModelSerialiser *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->autoParent(); break;
        case 1: _t->basicSaveLoadByteArray(); break;
        case 2: _t->basicSaveLoadFile(); break;
        case 3: _t->basicSaveLoadString(); break;
        case 4: _t->basicSaveLoadStream(); break;
        case 5: _t->basicSaveLoadNested(); break;
        case 6: _t->basicSaveLoadByteArray_data(); break;
        case 7: _t->basicSaveLoadFile_data(); break;
        case 8: _t->basicSaveLoadString_data(); break;
        case 9: _t->basicSaveLoadNested_data(); break;
        case 10: _t->basicSaveLoadStream_data(); break;
        case 11: _t->validateXmlOutput(); break;
        case 12: _t->validateXmlOutput_data(); break;
        default: ;
        }
    }
    (void)_a;
}